

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ParseFaceChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  value_type vVar1;
  char *s1;
  int8_t iVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  ulong uVar8;
  size_type sVar9;
  DeadlyImportError *this_01;
  reference pFVar10;
  long lVar11;
  char *s2;
  Logger *pLVar12;
  basic_formatter *this_02;
  reference pvVar13;
  uint local_234;
  uint fidx;
  uint i_2;
  string local_b8;
  __normal_iterator<Assimp::D3DS::Material_*,_std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>_>
  local_98;
  __normal_iterator<Assimp::D3DS::Material_*,_std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>_>
  local_90;
  __normal_iterator<const_Assimp::D3DS::Material_*,_std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>_>
  local_88;
  const_iterator i_1;
  uint cnt;
  uint idx;
  char *sz;
  iterator i;
  allocator<char> local_51;
  string local_50;
  uint local_30;
  uint local_2c;
  uint m;
  uint num;
  Mesh *mMesh;
  uint oldReadLimit;
  int chunkSize;
  Discreet3DSImporter *pDStack_10;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_10 = this;
  do {
    do {
      uVar5 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar5 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      mMesh._4_4_ = chunkSize + -6;
    } while (mMesh._4_4_ < 1);
    this_00 = this->stream;
    iVar6 = StreamReader<false,_false>::GetCurrentPos(this_00);
    mMesh._0_4_ = StreamReader<false,_false>::SetReadLimit(this_00,iVar6 + mMesh._4_4_);
    _m = std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::back
                   (&this->mScene->mMeshes);
    if (oldReadLimit._2_2_ == 0x4130) {
      _cnt = StreamReader<false,_false>::GetPtr(this->stream);
      do {
        iVar2 = StreamReader<false,_false>::GetI1(this->stream);
      } while (iVar2 != '\0');
      i_1._M_current._4_4_ = 0xcdcdcdcd;
      i_1._M_current._0_4_ = 0;
      local_90._M_current =
           (Material *)
           std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::begin
                     (&this->mScene->mMaterials);
      __gnu_cxx::
      __normal_iterator<Assimp::D3DS::Material_const*,std::vector<Assimp::D3DS::Material,std::allocator<Assimp::D3DS::Material>>>
      ::__normal_iterator<Assimp::D3DS::Material*>
                ((__normal_iterator<Assimp::D3DS::Material_const*,std::vector<Assimp::D3DS::Material,std::allocator<Assimp::D3DS::Material>>>
                  *)&local_88,&local_90);
      while( true ) {
        local_98._M_current =
             (Material *)
             std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::end
                       (&this->mScene->mMaterials);
        bVar3 = __gnu_cxx::operator!=(&local_88,&local_98);
        if (!bVar3) break;
        __gnu_cxx::
        __normal_iterator<const_Assimp::D3DS::Material_*,_std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>_>
        ::operator*(&local_88);
        lVar11 = std::__cxx11::string::length();
        s1 = _cnt;
        if (lVar11 != 0) {
          __gnu_cxx::
          __normal_iterator<const_Assimp::D3DS::Material_*,_std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>_>
          ::operator*(&local_88);
          s2 = (char *)std::__cxx11::string::c_str();
          iVar6 = ASSIMP_stricmp(s1,s2);
          if (iVar6 == 0) {
            i_1._M_current._4_4_ = (uint)i_1._M_current;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::D3DS::Material_*,_std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>_>
        ::operator++(&local_88);
        i_1._M_current._0_4_ = (uint)i_1._M_current + 1;
      }
      if (i_1._M_current._4_4_ == 0xcdcdcdcd) {
        pLVar12 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[24]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&fidx,
                   (char (*) [24])"3DS: Unknown material: ");
        this_02 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &fidx,(char **)&cnt);
        Formatter::basic_formatter::operator_cast_to_string(&local_b8,this_02);
        Logger::error(pLVar12,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fidx);
      }
      uVar4 = StreamReader<false,_false>::GetI2(this->stream);
      i_1._M_current._0_4_ = (uint)uVar4;
      for (local_234 = 0; local_234 < (uint)i_1._M_current; local_234 = local_234 + 1) {
        uVar4 = StreamReader<false,_false>::GetI2(this->stream);
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&_m->mFaceMaterials);
        vVar1 = i_1._M_current._4_4_;
        if ((uint)uVar4 < sVar9) {
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&_m->mFaceMaterials,(ulong)(uint)uVar4);
          *pvVar13 = vVar1;
        }
        else {
          pLVar12 = DefaultLogger::get();
          Logger::error(pLVar12,"3DS: Invalid face index in face material list");
        }
      }
    }
    else if (oldReadLimit._2_2_ == 0x4150) {
      local_2c = mMesh._4_4_ / 4;
      local_30 = 0;
      uVar8 = (ulong)local_2c;
      sVar9 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::size
                        (&(_m->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces);
      if (sVar9 < uVar8) {
        i._M_current._3_1_ = 1;
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"3DS: More smoothing groups than faces",&local_51);
        DeadlyImportError::DeadlyImportError(this_01,&local_50);
        i._M_current._3_1_ = 0;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      sz = (char *)std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::begin
                             (&(_m->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces);
      for (; local_30 != local_2c; local_30 = local_30 + 1) {
        uVar7 = StreamReader<false,_false>::GetI4(this->stream);
        pFVar10 = __gnu_cxx::
                  __normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
                  ::operator*((__normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
                               *)&sz);
        (pFVar10->super_FaceWithSmoothingGroup).iSmoothGroup = uVar7;
        __gnu_cxx::
        __normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
        ::operator++((__normal_iterator<Assimp::D3DS::Face_*,_std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>_>
                      *)&sz);
      }
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,(uint)mMesh);
    uVar5 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
    if (uVar5 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseFaceChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // Get the mesh we're currently working on
    D3DS::Mesh& mMesh = mScene->mMeshes.back();

    // Get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_SMOOLIST:
        {
        // This is the list of smoothing groups - a bitfield for every face.
        // Up to 32 smoothing groups assigned to a single face.
        unsigned int num = chunkSize/4, m = 0;
        if (num > mMesh.mFaces.size())  {
            throw DeadlyImportError("3DS: More smoothing groups than faces");
        }
        for (std::vector<D3DS::Face>::iterator i =  mMesh.mFaces.begin(); m != num;++i, ++m)    {
            // nth bit is set for nth smoothing group
            (*i).iSmoothGroup = stream->GetI4();
        }}
        break;

    case Discreet3DS::CHUNK_FACEMAT:
        {
        // at fist an asciiz with the material name
        const char* sz = (const char*)stream->GetPtr();
        while (stream->GetI1());

        // find the index of the material
        unsigned int idx = 0xcdcdcdcd, cnt = 0;
        for (std::vector<D3DS::Material>::const_iterator i =  mScene->mMaterials.begin();i != mScene->mMaterials.end();++i,++cnt)   {
            // use case independent comparisons. hopefully it will work.
            if ((*i).mName.length() && !ASSIMP_stricmp(sz, (*i).mName.c_str())) {
                idx = cnt;
                break;
            }
        }
        if (0xcdcdcdcd == idx)  {
            ASSIMP_LOG_ERROR_F( "3DS: Unknown material: ", sz);
        }

        // Now continue and read all material indices
        cnt = (uint16_t)stream->GetI2();
        for (unsigned int i = 0; i < cnt;++i)   {
            unsigned int fidx = (uint16_t)stream->GetI2();

            // check range
            if (fidx >= mMesh.mFaceMaterials.size())    {
                ASSIMP_LOG_ERROR("3DS: Invalid face index in face material list");
            }
            else mMesh.mFaceMaterials[fidx] = idx;
        }}
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}